

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void CConsole::ConToggle(IResult *pResult,void *pUser)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  CCommand *pCVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FCommandCallback p_Var8;
  char *format;
  long in_FS_OFFSET;
  char aBuf [128];
  ulong local_a8 [17];
  long local_20;
  undefined4 extraout_var_00;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
  pCVar5 = FindCommand((CConsole *)pUser,(char *)CONCAT44(extraout_var,iVar2),
                       *(int *)((long)pUser + 0x10));
  if (pCVar5 == (CCommand *)0x0) {
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
    uVar7 = CONCAT44(extraout_var_01,iVar2);
    format = "No such command: \'%s\'.";
  }
  else {
    pvVar6 = pCVar5->m_pUserData;
    p_Var8 = pCVar5->m_pfnCallback;
    while (p_Var8 == Con_Chain) {
      puVar1 = (undefined8 *)((long)pvVar6 + 8);
      pvVar6 = *(void **)((long)pvVar6 + 0x10);
      p_Var8 = (FCommandCallback)*puVar1;
    }
    if (p_Var8 == IntVariableCommand) {
      iVar2 = **(int **)((long)pvVar6 + 8);
      iVar3 = (*pResult->_vptr_IResult[2])(pResult,1);
      uVar4 = (*pResult->_vptr_IResult[2])(pResult,(ulong)((iVar2 == iVar3) + 1));
      iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
      str_format((char *)local_a8,0x80,"%s %i",CONCAT44(extraout_var_02,iVar2),(ulong)uVar4);
      (**(code **)(*pUser + 0x98))(pUser,local_a8);
      local_a8[0] = local_a8[0] & 0xffffffffffffff00;
      goto LAB_001ba535;
    }
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,0);
    uVar7 = CONCAT44(extraout_var_00,iVar2);
    format = "Invalid command: \'%s\'.";
  }
  str_format((char *)local_a8,0x80,format,uVar7);
LAB_001ba535:
  if ((char)local_a8[0] != '\0') {
    (**(code **)(*pUser + 200))(pUser,0,"console",local_a8,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::ConToggle(IConsole::IResult *pResult, void *pUser)
{
	CConsole *pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128] = {0};
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(0), pConsole->m_FlagMask);
	if(pCommand)
	{
		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		pConsole->TraverseChain(&pfnCallback, &pUserData);
		if(pfnCallback == IntVariableCommand)
		{
			CIntVariableData *pData = static_cast<CIntVariableData *>(pUserData);
			int Val = *(pData->m_pVariable)==pResult->GetInteger(1) ? pResult->GetInteger(2) : pResult->GetInteger(1);
			str_format(aBuf, sizeof(aBuf), "%s %i", pResult->GetString(0), Val);
			pConsole->ExecuteLine(aBuf);
			aBuf[0] = 0;
		}
		else
			str_format(aBuf, sizeof(aBuf), "Invalid command: '%s'.", pResult->GetString(0));
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(0));

	if(aBuf[0])
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}